

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

basic_appender<char> __thiscall
fmt::v11::detail::write_nonfinite<char,fmt::v11::basic_appender<char>>
          (detail *this,basic_appender<char> out,bool isnan,format_specs specs,sign s)

{
  basic_appender<char> bVar1;
  char *pcVar2;
  size_t size;
  uint uVar3;
  undefined7 in_register_00000011;
  basic_specs bVar4;
  bool bVar5;
  undefined1 local_20 [16];
  anon_class_16_2_fa5d9fc7 local_10;
  
  bVar4._1_7_ = in_register_00000011;
  bVar4.data_._0_1_ = isnan;
  local_20._8_8_ = specs.super_basic_specs;
  uVar3 = bVar4.data_;
  local_20._0_8_ = bVar4;
  if (((uVar3 & 0x38000) == 0x8000) &&
     (local_20[4] = (char)((uint7)in_register_00000011 >> 0x18), bVar5 = local_20[4] == '0', bVar5))
  {
    local_20._5_3_ = (undefined3)((uint7)in_register_00000011 >> 0x20);
    local_20._0_5_ = 0x2000000000;
    local_20._0_4_ = uVar3;
  }
  bVar5 = (uVar3 >> 0xc & 1) == 0;
  pcVar2 = "NAN";
  if (bVar5) {
    pcVar2 = "nan";
  }
  local_10.str = "INF";
  if (bVar5) {
    local_10.str = "inf";
  }
  if ((char)out.container != '\0') {
    local_10.str = pcVar2;
  }
  local_10.s = specs.width;
  size = 4 - (ulong)(local_10.s == none);
  bVar1 = write_padded<char,(fmt::v11::align)1,fmt::v11::basic_appender<char>,fmt::v11::detail::write_nonfinite<char,fmt::v11::basic_appender<char>>(fmt::v11::basic_appender<char>,bool,fmt::v11::format_specs,fmt::v11::sign)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                    ((basic_appender<char>)this,(format_specs *)local_20,size,size,&local_10);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_nonfinite(OutputIt out, bool isnan,
                                     format_specs specs, sign s) -> OutputIt {
  auto str =
      isnan ? (specs.upper() ? "NAN" : "nan") : (specs.upper() ? "INF" : "inf");
  constexpr size_t str_size = 3;
  auto size = str_size + (s != sign::none ? 1 : 0);
  // Replace '0'-padding with space for non-finite values.
  const bool is_zero_fill =
      specs.fill_size() == 1 && specs.fill_unit<Char>() == '0';
  if (is_zero_fill) specs.set_fill(' ');
  return write_padded<Char>(out, specs, size,
                            [=](reserve_iterator<OutputIt> it) {
                              if (s != sign::none)
                                *it++ = detail::getsign<Char>(s);
                              return copy<Char>(str, str + str_size, it);
                            });
}